

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fromucs.c
# Opt level: O0

wchar_t charset_from_unicode
                  (wchar_t **input,wchar_t *inlen,char *output,wchar_t outlen,wchar_t charset,
                  charset_state *state,char *errstr,wchar_t errlen)

{
  int iVar1;
  charset_spec_conflict *pcVar2;
  char *pcStack_68;
  wchar_t lenbefore;
  charset_emit_param param;
  charset_state localstate;
  charset_spec *spec;
  charset_state *state_local;
  wchar_t charset_local;
  wchar_t outlen_local;
  char *output_local;
  wchar_t *inlen_local;
  wchar_t **input_local;
  
  pcVar2 = charset_find_spec(charset);
  param.errstr._4_4_ = 0;
  param._8_8_ = errstr;
  param.errstr._0_4_ = errlen;
  pcStack_68 = output;
  param.output._0_4_ = outlen;
  if (state == (charset_state *)0x0) {
    param.errlen = 0;
    param.stopped = 0;
  }
  else {
    param._24_8_ = state->s0;
  }
  while( true ) {
    iVar1 = (int)pcStack_68;
    if ((*inlen < L'\x01') ||
       ((*pcVar2->write)(pcVar2,(long)**input,(charset_state *)&param.errlen,charset_emit,
                         &stack0xffffffffffffff98), param.errstr._4_4_ != 0)) break;
    *input = *input + 1;
    *inlen = *inlen + L'\xffffffff';
  }
  input_local._4_4_ = iVar1 - (int)output;
  return input_local._4_4_;
}

Assistant:

int charset_from_unicode(const wchar_t **input, int *inlen,
                         char *output, int outlen,
                         int charset, charset_state *state,
                         const char *errstr, int errlen)
{
    charset_spec const *spec = charset_find_spec(charset);
    charset_state localstate;
    struct charset_emit_param param;

    param.output = output;
    param.outlen = outlen;
    param.stopped = 0;

    /*
     * charset_emit will expect a valid errstr.
     */
    if (!errstr) {
        /* *shrug* this is good enough, and consistent across all SBCS... */
        param.errstr = ".";
        param.errlen = 1;
    }
    param.errstr = errstr;
    param.errlen = errlen;

    if (!state) {
        localstate.s0 = 0;
    } else {
        localstate = *state;           /* structure copy */
    }
    state = &localstate;

    while (*inlen > 0) {
        int lenbefore = param.output - output;
        spec->write(spec, **input, &localstate, charset_emit, &param);
        if (param.stopped) {
            /*
             * The emit function has _tried_ to output some
             * characters, but ran up against the end of the
             * buffer. Leave immediately, and return what happened
             * _before_ attempting to process this character.
             */
            return lenbefore;
        }
        if (state)
            *state = localstate;       /* structure copy */
        (*input)++;
        (*inlen)--;
    }
    return param.output - output;
}